

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O0

void __thiscall booster::regex::assign(regex *this,string *pattern,int flags)

{
  uint uVar1;
  string *psVar2;
  int iVar3;
  data *pdVar4;
  undefined8 uVar5;
  pcre *ppVar6;
  ostream *poVar7;
  regex_error *this_00;
  uint in_EDX;
  string *in_RSI;
  copy_ptr<booster::regex::data> *in_RDI;
  string anchored;
  ostringstream ss;
  pcre *p;
  int pcre_flags;
  int offset;
  char *err_ptr;
  string *in_stack_fffffffffffffca8;
  data *in_stack_fffffffffffffcb0;
  data *in_stack_fffffffffffffcb8;
  allocator *paVar8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [32];
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [39];
  undefined1 local_1d9;
  ostringstream local_1b8 [376];
  pcre *local_40;
  uint local_38;
  int local_34;
  char *local_30 [3];
  uint local_14;
  string *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  operator_new(0x50);
  data::data(in_stack_fffffffffffffcb0);
  copy_ptr<booster::regex::data>::reset
            ((copy_ptr<booster::regex::data> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),in_stack_fffffffffffffcb8
            );
  psVar2 = local_10;
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  std::__cxx11::string::operator=((string *)pdVar4,psVar2);
  uVar1 = local_14;
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  pdVar4->flags = uVar1;
  local_30[0] = (char *)0x0;
  local_34 = 0;
  local_38 = (uint)((local_14 & 0x100) != 0);
  if ((local_14 & 0x200) != 0) {
    local_38 = local_38 | 0x800;
  }
  uVar5 = std::__cxx11::string::c_str();
  ppVar6 = (pcre *)pcre_compile(uVar5,local_38,local_30,&local_34,0);
  local_40 = ppVar6;
  if (ppVar6 == (pcre *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar7 = std::operator<<((ostream *)local_1b8,"booster::regex:");
    poVar7 = std::operator<<(poVar7,local_30[0]);
    poVar7 = std::operator<<(poVar7,", at offset ");
    std::ostream::operator<<(poVar7,local_34);
    local_1d9 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    regex_error::regex_error((regex_error *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    local_1d9 = 0;
    __cxa_throw(uVar5,&regex_error::typeinfo,regex_error::~regex_error);
  }
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  pdVar4->re = ppVar6;
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  ppVar6 = pdVar4->re;
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  iVar3 = pcre_fullinfo(ppVar6,0,1,&pdVar4->re_size);
  if (-1 < iVar3) {
    pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
    ppVar6 = pdVar4->re;
    pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
    iVar3 = pcre_fullinfo(ppVar6,0,2,&pdVar4->match_size);
    if (-1 < iVar3) {
      std::__cxx11::string::string(local_228);
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)local_228);
      std::__cxx11::string::operator+=(local_228,"(?:");
      std::__cxx11::string::operator+=(local_228,local_10);
      std::__cxx11::string::operator+=(local_228,")\\z");
      uVar5 = std::__cxx11::string::c_str();
      ppVar6 = (pcre *)pcre_compile(uVar5,local_38,local_30,&local_34,0);
      local_40 = ppVar6;
      if (ppVar6 == (pcre *)0x0) {
        local_24a = 1;
        uVar5 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,"booster::regex: Internal error",&local_249);
        regex_error::regex_error((regex_error *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
        ;
        local_24a = 0;
        __cxa_throw(uVar5,&regex_error::typeinfo,regex_error::~regex_error);
      }
      pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
      pdVar4->are = ppVar6;
      pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
      ppVar6 = pdVar4->are;
      pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
      iVar3 = pcre_fullinfo(ppVar6,0,1,&pdVar4->are_size);
      if (iVar3 != 0) {
        this_00 = (regex_error *)__cxa_allocate_exception(0x30);
        paVar8 = &local_271;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_270,"booster::regex: Internal error",paVar8);
        regex_error::regex_error(this_00,in_stack_fffffffffffffca8);
        __cxa_throw(this_00,&regex_error::typeinfo,regex_error::~regex_error);
      }
      std::__cxx11::string::~string(local_228);
      return;
    }
  }
  local_202 = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"booster::regex: Internal error",&local_201);
  regex_error::regex_error((regex_error *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  local_202 = 0;
  __cxa_throw(uVar5,&regex_error::typeinfo,regex_error::~regex_error);
}

Assistant:

void regex::assign(std::string const &pattern,int flags)
	{
		d.reset(new data());
		d->expression=pattern;
		d->flags = flags;
		char const *err_ptr = 0;
		int offset = 0;
		int pcre_flags = 0;
		if(flags & icase) {
			pcre_flags |= PCRE_CASELESS;
		}
		if(flags & utf8) {
			#ifndef PCRE_UTF8
			throw regex_error("PCRE Library does not support UTF-8 please upgrade");
			#else
			pcre_flags |= PCRE_UTF8;
			#endif
		}
		pcre *p=pcre_compile(pattern.c_str(),pcre_flags,&err_ptr,&offset,0);
		if(!p) {
			std::ostringstream ss;
			ss << "booster::regex:" << err_ptr <<", at offset "<<offset;
			throw regex_error(ss.str());
		}
		d->re = p;
		if(	pcre_fullinfo(d->re,NULL,PCRE_INFO_SIZE,&d->re_size) < 0
			|| pcre_fullinfo(d->re,NULL,PCRE_INFO_CAPTURECOUNT,&d->match_size) < 0)
		{
			throw regex_error("booster::regex: Internal error");
		}
		
		std::string anchored;
		anchored.reserve(pattern.size()+6);
		anchored+= "(?:";
		anchored+=pattern;
		anchored+=")\\z";

		p=pcre_compile(anchored.c_str(),pcre_flags,&err_ptr,&offset,0);
		if(!p) {
			throw regex_error("booster::regex: Internal error");
		}
		d->are = p;
		if(pcre_fullinfo(d->are,NULL,PCRE_INFO_SIZE,&d->are_size) != 0)
		{
			throw regex_error("booster::regex: Internal error");
		}
	}